

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void vli_modInv_update(uECC_word_t *uv,uECC_word_t *mod,wordcount_t num_words)

{
  byte *pbVar1;
  ulong uVar2;
  uECC_word_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((*uv & 1) == 0) {
    if ('\0' < num_words) {
      puVar3 = uv + (byte)num_words;
      uVar5 = 0;
      do {
        uVar6 = puVar3[-1];
        puVar3[-1] = uVar6 >> 1 | uVar5;
        puVar3 = puVar3 + -1;
        uVar5 = uVar6 << 0x3f;
      } while (uv < puVar3);
    }
  }
  else if ('\0' < num_words) {
    uVar6 = 0;
    uVar5 = 0;
    do {
      uVar2 = uv[uVar6];
      uVar7 = uVar2 + uVar5 + mod[uVar6];
      uVar4 = (ulong)(uVar7 < uVar2);
      if (uVar7 == uVar2) {
        uVar4 = uVar5;
      }
      uv[uVar6] = uVar7;
      uVar6 = uVar6 + 1;
      uVar5 = uVar4;
    } while ((byte)num_words != uVar6);
    uVar5 = 0;
    puVar3 = uv + (byte)num_words;
    do {
      uVar6 = puVar3[-1];
      puVar3[-1] = uVar6 >> 1 | uVar5;
      puVar3 = puVar3 + -1;
      uVar5 = uVar6 << 0x3f;
    } while (uv < puVar3);
    if (uVar4 != 0) {
      pbVar1 = (byte *)((long)(uv + (byte)num_words) - 1);
      *pbVar1 = *pbVar1 | 0x80;
      return;
    }
  }
  return;
}

Assistant:

static void vli_modInv_update(uECC_word_t *uv,
                              const uECC_word_t *mod,
                              wordcount_t num_words) {
    uECC_word_t carry = 0;
    if (!EVEN(uv)) {
        carry = uECC_vli_add(uv, uv, mod, num_words);
    }
    uECC_vli_rshift1(uv, num_words);
    if (carry) {
        uv[num_words - 1] |= HIGH_BIT_SET;
    }
}